

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O1

ptrlen pty_backend_exit_signame(Backend *be,char **aux_msg)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  uint __sig;
  ptrlen pVar4;
  
  *aux_msg = (char *)0x0;
  __sig = 0xffffffff;
  if (*(char *)((long)&be[-4].vt + 5) == '\x01') {
    uVar1 = *(uint *)&be[-4].interactor & 0x7f;
    __sig = 0xffffffff;
    if (0x1ffffff < (int)(uVar1 * 0x1000000 + 0x1000000)) {
      __sig = uVar1;
    }
  }
  if ((int)__sig < 0) {
    pcVar2 = "";
    sVar3 = 0;
  }
  else {
    sVar3 = 3;
    switch(__sig) {
    case 2:
      pcVar2 = "INT";
      break;
    case 3:
      sVar3 = 4;
      pcVar2 = "QUIT";
      break;
    case 4:
      pcVar2 = "ILL";
      break;
    default:
      pcVar2 = strsignal(__sig);
      pcVar2 = dupprintf("untranslatable signal number %d: %s",(ulong)__sig,pcVar2);
      *aux_msg = pcVar2;
    case 1:
      pcVar2 = "HUP";
      break;
    case 6:
      sVar3 = 4;
      pcVar2 = "ABRT";
      break;
    case 8:
      pcVar2 = "FPE";
      break;
    case 9:
      sVar3 = 4;
      pcVar2 = "KILL";
      break;
    case 10:
      sVar3 = 4;
      pcVar2 = "USR1";
      break;
    case 0xb:
      sVar3 = 4;
      pcVar2 = "SEGV";
      break;
    case 0xc:
      sVar3 = 4;
      pcVar2 = "USR2";
      break;
    case 0xd:
      sVar3 = 4;
      pcVar2 = "PIPE";
      break;
    case 0xe:
      sVar3 = 4;
      pcVar2 = "ALRM";
      break;
    case 0xf:
      sVar3 = 4;
      pcVar2 = "TERM";
    }
  }
  pVar4.len = sVar3;
  pVar4.ptr = pcVar2;
  return pVar4;
}

Assistant:

ptrlen pty_backend_exit_signame(Backend *be, char **aux_msg)
{
    *aux_msg = NULL;

    int sig = pty_backend_exit_signum(be);
    if (sig < 0)
        return PTRLEN_LITERAL("");

    #define SIGNAL_SUB(s) {                             \
        if (sig == SIG ## s)                            \
            return PTRLEN_LITERAL(#s);                  \
    }
    #define SIGNAL_MAIN(s, desc) SIGNAL_SUB(s)
    #define SIGNALS_LOCAL_ONLY
    #include "ssh/signal-list.h"
    #undef SIGNAL_MAIN
    #undef SIGNAL_SUB
    #undef SIGNALS_LOCAL_ONLY

    *aux_msg = dupprintf("untranslatable signal number %d: %s",
                         sig, strsignal(sig));
    return PTRLEN_LITERAL("HUP");      /* need some kind of default */
}